

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status
fdb_kvs_open(fdb_file_handle *fhandle,fdb_kvs_handle **ptr_handle,char *kvs_name,
            fdb_kvs_config *kvs_config)

{
  kvs_header *pkVar1;
  fdb_custom_cmp_variable cmp_func;
  void *cmp_func_user_param;
  bool bVar2;
  int iVar3;
  fdb_status fVar4;
  fdb_kvs_handle *pfVar5;
  fdb_kvs_handle *handle;
  size_t line_number;
  char *format;
  filemgr *file;
  void *default_kvs_cmp_param;
  fdb_kvs_config local_158;
  filemgr *local_138;
  fdb_custom_cmp_variable default_kvs_cmp;
  fdb_config config;
  
  if (fhandle == (fdb_file_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  pfVar5 = fhandle->root;
  if (pfVar5 == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  memcpy(&config,&pfVar5->config,0xf8);
  if (kvs_config == (fdb_kvs_config *)0x0) {
    get_default_kvs_config();
  }
  else {
    bVar2 = validate_fdb_kvs_config(kvs_config);
    if (!bVar2) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    local_158.custom_cmp_param = kvs_config->custom_cmp_param;
    local_158.create_if_missing = kvs_config->create_if_missing;
    local_158._1_7_ = *(undefined7 *)&kvs_config->field_0x1;
    local_158.custom_cmp = kvs_config->custom_cmp;
  }
  fdb_check_file_reopen(pfVar5,(file_status_t *)0x0);
  fdb_sync_db_header(pfVar5);
  file = pfVar5->file;
  if ((kvs_name != (char *)0x0) && (iVar3 = strcmp(kvs_name,"default"), iVar3 != 0)) {
    if (config.multi_kv_instances == false) {
      format = 
      "Cannot open KV store instance \'%s\' because multi-KV store instance mode is disabled.";
      fVar4 = FDB_RESULT_INVALID_CONFIG;
      line_number = 0x70c;
    }
    else if (pfVar5->kvs->type == '\0') {
      if (pfVar5->shandle == (snap_handle *)0x0) {
        handle = (fdb_kvs_handle *)calloc(1,0x208);
        if (handle == (fdb_kvs_handle *)0x0) {
          return FDB_RESULT_ALLOC_FAIL;
        }
        LOCK();
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        UNLOCK();
        handle->fhandle = fhandle;
        fVar4 = _fdb_kvs_open(pfVar5,&config,&local_158,file,file->filename,kvs_name,handle);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          *ptr_handle = (fdb_kvs_handle *)0x0;
          free(handle);
          return fVar4;
        }
        *ptr_handle = handle;
        return FDB_RESULT_SUCCESS;
      }
      format = "Not allowed to open KV store instance \'%s\' from the snapshot handle.";
      fVar4 = FDB_RESULT_INVALID_ARGS;
      line_number = 0x71b;
    }
    else {
      format = 
      "Cannot open KV store instance \'%s\' because the handle doesn\'t support multi-KV sotre instance mode."
      ;
      fVar4 = FDB_RESULT_INVALID_HANDLE;
      line_number = 0x713;
    }
    fVar4 = fdb_log_impl(&pfVar5->log_callback,2,fVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                         ,"fdb_kvs_open",line_number,format,kvs_name);
    return fVar4;
  }
  pthread_spin_lock(&fhandle->lock);
  if ((fhandle->flags & 1) != 0) goto LAB_0013bfe9;
  default_kvs_cmp = (fdb_custom_cmp_variable)0x0;
  default_kvs_cmp_param = (void *)0x0;
  (pfVar5->kvs_config).custom_cmp_param = local_158.custom_cmp_param;
  (pfVar5->kvs_config).create_if_missing = local_158.create_if_missing;
  *(undefined7 *)&(pfVar5->kvs_config).field_0x1 = local_158._1_7_;
  (pfVar5->kvs_config).custom_cmp = local_158.custom_cmp;
  pkVar1 = pfVar5->file->kv_header;
  local_138 = file;
  if (pkVar1 != (kvs_header *)0x0) {
    fdb_kvs_find_cmp_name(pfVar5,kvs_name,&default_kvs_cmp,&default_kvs_cmp_param);
    pthread_spin_lock(&pkVar1->lock);
    pkVar1->default_kvs_cmp = default_kvs_cmp;
    pkVar1->default_kvs_cmp_param = default_kvs_cmp_param;
    if (default_kvs_cmp == (fdb_custom_cmp_variable)0x0) {
      cmp_func = (pfVar5->kvs_config).custom_cmp;
      if (cmp_func != (fdb_custom_cmp_variable)0x0) {
        pkVar1->default_kvs_cmp = cmp_func;
        cmp_func_user_param = (pfVar5->kvs_config).custom_cmp_param;
        pkVar1->default_kvs_cmp_param = cmp_func_user_param;
        fdb_file_handle_add_cmp_func(fhandle,(char *)0x0,cmp_func,cmp_func_user_param);
        if (pkVar1->default_kvs_cmp != (fdb_custom_cmp_variable)0x0) goto LAB_0013bfc1;
      }
    }
    else {
LAB_0013bfc1:
      pkVar1->custom_cmp_enabled = '\x01';
      *(byte *)&fhandle->flags = (byte)fhandle->flags | 4;
    }
    pthread_spin_unlock(&pfVar5->file->kv_header->lock);
  }
  *(byte *)&fhandle->flags = (byte)fhandle->flags | 3;
  file = local_138;
LAB_0013bfe9:
  pthread_spin_unlock(&fhandle->lock);
  pfVar5 = (fdb_kvs_handle *)calloc(1,0x208);
  (pfVar5->kvs_config).create_if_missing = local_158.create_if_missing;
  *(undefined7 *)&(pfVar5->kvs_config).field_0x1 = local_158._1_7_;
  (pfVar5->kvs_config).custom_cmp = local_158.custom_cmp;
  (pfVar5->kvs_config).custom_cmp_param = local_158.custom_cmp_param;
  LOCK();
  (pfVar5->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
  UNLOCK();
  pfVar5->fhandle = fhandle;
  fVar4 = _fdb_open(pfVar5,file->filename,FDB_AFILENAME,&config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    _fdb_kvs_createNLinkKVHandle(fhandle,pfVar5);
  }
  else {
    free(pfVar5);
    pfVar5 = (fdb_kvs_handle *)0x0;
  }
  *ptr_handle = pfVar5;
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_kvs_open(fdb_file_handle *fhandle,
                        fdb_kvs_handle **ptr_handle,
                        const char *kvs_name,
                        fdb_kvs_config *kvs_config)
{
    fdb_kvs_handle *handle;
    fdb_config config;
    fdb_status fs;
    fdb_kvs_handle *root_handle;
    fdb_kvs_config config_local;
    struct filemgr *file = NULL;
    struct filemgr *latest_file = NULL;
    LATENCY_STAT_START();

    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    root_handle = fhandle->root;
    config = root_handle->config;

    if (kvs_config) {
        if (validate_fdb_kvs_config(kvs_config)) {
            config_local = *kvs_config;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        config_local = get_default_kvs_config();
    }

    fdb_check_file_reopen(root_handle, NULL);
    fdb_sync_db_header(root_handle);

    file = root_handle->file;
    latest_file = root_handle->file;

    if (kvs_name == NULL || !strcmp(kvs_name, default_kvs_name)) {
        // return the default KV store handle
        spin_lock(&fhandle->lock);
        if (!(fhandle->flags & FHANDLE_ROOT_OPENED)) {
            // the root handle is not opened yet
            // sync up the root handle
            fdb_custom_cmp_variable default_kvs_cmp = NULL;
            void* default_kvs_cmp_param = NULL;

            root_handle->kvs_config = config_local;

            if (root_handle->file->kv_header) {
                struct kvs_header* kvsh = root_handle->file->kv_header;

                // search fhandle's custom cmp func list first
                fdb_kvs_find_cmp_name(root_handle,
                                      (char *)kvs_name,
                                      &default_kvs_cmp,
                                      &default_kvs_cmp_param);

                spin_lock(&kvsh->lock);
                kvsh->default_kvs_cmp = default_kvs_cmp;
                kvsh->default_kvs_cmp_param = default_kvs_cmp_param;

                if ( kvsh->default_kvs_cmp == NULL &&
                     root_handle->kvs_config.custom_cmp ) {
                    // follow kvs_config's custom cmp next
                    kvsh->default_kvs_cmp = root_handle->kvs_config.custom_cmp;
                    kvsh->default_kvs_cmp_param = root_handle->kvs_config.custom_cmp_param;
                    fdb_file_handle_add_cmp_func(fhandle,
                                                 NULL,
                                                 root_handle->kvs_config.custom_cmp,
                                                 root_handle->kvs_config.custom_cmp_param);
                }

                if (kvsh->default_kvs_cmp) {
                    kvsh->custom_cmp_enabled = 1;
                    fhandle->flags |= FHANDLE_ROOT_CUSTOM_CMP;
                }
                spin_unlock(&root_handle->file->kv_header->lock);
            }

            fhandle->flags |= FHANDLE_ROOT_INITIALIZED;
            fhandle->flags |= FHANDLE_ROOT_OPENED;
        }
        // the root handle is already synced
        // open new default KV store handle
        spin_unlock(&fhandle->lock);
        handle = (fdb_kvs_handle*)calloc(1, sizeof(fdb_kvs_handle));
        handle->kvs_config = config_local;
        atomic_init_uint8_t(&handle->handle_busy, 0);

        handle->fhandle = fhandle;
        fs = _fdb_open(handle, file->filename, FDB_AFILENAME, &config);
        if (fs != FDB_RESULT_SUCCESS) {
            free(handle);
            *ptr_handle = NULL;
        } else {
            // insert into fhandle's list
            _fdb_kvs_createNLinkKVHandle(fhandle, handle);
            *ptr_handle = handle;
        }
        LATENCY_STAT_END(file, FDB_LATENCY_KVS_OPEN);
        return fs;
    }

    if (config.multi_kv_instances == false) {
        // cannot open KV instance under single DB instance mode
        return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_INVALID_CONFIG,
                       "Cannot open KV store instance '%s' because multi-KV "
                       "store instance mode is disabled.",
                       kvs_name ? kvs_name : DEFAULT_KVS_NAME);
    }
    if (root_handle->kvs->type != KVS_ROOT) {
        return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_INVALID_HANDLE,
                       "Cannot open KV store instance '%s' because the handle "
                       "doesn't support multi-KV sotre instance mode.",
                       kvs_name ? kvs_name : DEFAULT_KVS_NAME);
    }
    if (root_handle->shandle) {
        // cannot open KV instance from a snapshot
        return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_INVALID_ARGS,
                       "Not allowed to open KV store instance '%s' from the "
                       "snapshot handle.",
                       kvs_name ? kvs_name : DEFAULT_KVS_NAME);
    }

    handle = (fdb_kvs_handle *)calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->fhandle = fhandle;
    fs = _fdb_kvs_open(root_handle, &config, &config_local,
                       latest_file, file->filename, kvs_name, handle);
    if (fs == FDB_RESULT_SUCCESS) {
        *ptr_handle = handle;
    } else {
        *ptr_handle = NULL;
        free(handle);
    }
    LATENCY_STAT_END(file, FDB_LATENCY_KVS_OPEN);
    return fs;
}